

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse_epoch(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type previous;
  longlong epoch;
  longlong local_20;
  
  previous = Pig::cursor(pig);
  local_20 = 0;
  bVar1 = Pig::getDigits(pig,&local_20);
  if (bVar1) {
    c = Pig::peek(pig);
    bVar1 = unicodeLatinAlpha(c);
    if ((!bVar1) && (0xffffffc512da80a0 < local_20 - 0x3afff4255fU)) {
      this->_date = local_20;
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_epoch (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  long long epoch {};
  if (pig.getDigits (epoch)             &&
      ! unicodeLatinAlpha (pig.peek ()) &&
      epoch >= EPOCH_MIN_VALUE          &&
      epoch < EPOCH_MAX_VALUE)
  {
    _date = static_cast <time_t> (epoch);
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}